

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# representation.cpp
# Opt level: O3

void FenToSituation(Situation *situation,char *fen,int num_of_movements,char *movements)

{
  char cVar1;
  int piece_id;
  uint uVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  char *pcVar6;
  Movement MVar7;
  string s;
  int piece_id_array [14];
  string local_b8;
  undefined1 *local_98;
  long local_90;
  undefined1 local_88 [16];
  Movement local_78;
  int local_68 [14];
  
  local_68[8] = 0x21;
  local_68[9] = 0x23;
  local_68[10] = 0x25;
  local_68[0xb] = 0x27;
  local_68[4] = 0x17;
  local_68[5] = 0x19;
  local_68[6] = 0x1b;
  local_68[7] = 0x20;
  local_68[0] = 0x10;
  local_68[1] = 0x11;
  local_68[2] = 0x13;
  local_68[3] = 0x15;
  local_68[0xc] = 0x29;
  local_68[0xd] = 0x2b;
  pcVar6 = fen + 1;
  iVar3 = 3;
  uVar4 = 3;
  do {
    cVar1 = pcVar6[-1];
    if (cVar1 == '/') {
      iVar3 = iVar3 + 1;
      uVar4 = 3;
    }
    else {
      if (cVar1 == ' ') {
        cVar1 = *pcVar6;
        situation->current_player = (uint)(cVar1 != 'w');
        if (cVar1 == 'w') {
          ZobristKey = ZobristKey ^ ZobristPlayer;
          ZobristKeyCheck = ZobristKeyCheck ^ ZobristPlayerCheck;
        }
        if (0 < num_of_movements) {
          iVar3 = 0;
          do {
            local_98 = local_88;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"");
            lVar5 = 0;
            do {
              std::__cxx11::string::push_back((char)(string *)&local_98);
              lVar5 = lVar5 + 1;
            } while (lVar5 != 4);
            local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_b8,local_98,local_98 + local_90);
            MVar7 = StrToMovement(&local_b8);
            local_78._0_8_ = MVar7._0_8_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
              operator_delete(local_b8._M_dataplus._M_p);
            }
            MakeAMove(situation,&local_78,true);
            if (local_98 != local_88) {
              operator_delete(local_98);
            }
            iVar3 = iVar3 + 1;
          } while (iVar3 != num_of_movements);
        }
        return;
      }
      if ((byte)(cVar1 - 0x31U) < 9) {
        uVar4 = uVar4 + (byte)(cVar1 - 0x30);
      }
      else {
        uVar2 = PieceOfFen(cVar1);
        piece_id = local_68[uVar2];
        local_68[uVar2] = piece_id + 1;
        AddPiece(iVar3 << 4 | uVar4,piece_id,situation);
        uVar4 = uVar4 + 1;
      }
    }
    pcVar6 = pcVar6 + 1;
  } while( true );
}

Assistant:

void FenToSituation(Situation & situation, const char* fen, const int num_of_movements, const char *movements){
    const char *p = fen;
    int piece_id_array[14] = {16, 17, 19, 21, 23, 25, 27, 32, 33, 35, 37, 39, 41, 43};
    int col = GetCol(BOARD_FIRST_POSITION), row = GetRow(BOARD_FIRST_POSITION), piece_id_index, piece_id;
    // 1. 写入局面
    while(*p != ' '){
        if(*p == '/'){
            col = 3;
            row ++;
        }
        else if(*p > '0' && *p <= '9'){
            int no_piece = *p - '0';
            col += no_piece;
        }
        else{
            piece_id_index = PieceOfFen(*p);
            piece_id = piece_id_array[piece_id_index];
            piece_id_array[piece_id_index] ++;
            AddPiece(GetPosition(col, row), piece_id, situation);
            col ++;
        }
        p ++;
    }

    // 2. 写入当前玩家
    p ++;
    if(*p == 'w') situation.current_player = RED;
    else situation.current_player = BLACK;

    // 3. 若轮到红方走子，局面哈希值异或额外标记
    if(situation.current_player == RED){
        ZobristKey ^= ZobristPlayer;
        ZobristKeyCheck ^= ZobristPlayerCheck;
    }

    // 4. 将后续着法转入局面
    int j = 0;
    for ( int n = 0; n < num_of_movements; n ++ ) {
    	std::string s = "";
    	for (int k = j; k < j + 4; k ++ ) {
    		s += movements[k];
    	}
    	Movement move = StrToMovement(s);
        MakeAMove(situation, move, 1);
    	j += 5;
    }
}